

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_resetCStream_internal
                 (ZSTD_CStream *cctx,void *dict,size_t dictSize,
                 ZSTD_dictContentType_e dictContentType,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 unsigned_long_long pledgedSrcSize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  ZSTD_compressionParameters local_4c;
  
  ZSTD_getCParamsFromCCtxParams(&local_4c,&params,pledgedSrcSize,dictSize);
  params.cParams.targetLength = local_4c.targetLength;
  params.cParams.strategy = local_4c.strategy;
  params.cParams.windowLog = local_4c.windowLog;
  params.cParams.chainLog = local_4c.chainLog;
  auVar1._8_4_ = local_4c.hashLog;
  auVar1._0_4_ = local_4c.windowLog;
  auVar1._4_4_ = local_4c.chainLog;
  auVar1._12_4_ = local_4c.searchLog;
  auVar1 = vpaddd_avx(auVar1,_DAT_001b5ab0);
  auVar2 = vpminud_avx(auVar1,_DAT_001b5ac0);
  auVar1 = vpcmpeqd_avx(auVar1,auVar2);
  if (((((((auVar1 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
          (auVar1 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar1 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar1[0xf]) &&
       (local_4c.minMatch - 3 < 5)) && (params.cParams.targetLength < 0x20001)) &&
     (params.cParams.strategy - ZSTD_fast < 9)) {
    if (cdict == (ZSTD_CDict *)0x0 || dict == (void *)0x0) {
      sVar3 = ZSTD_compressBegin_internal
                        (cctx,dict,dictSize,dictContentType,ZSTD_dtlm_fast,cdict,&params,
                         pledgedSrcSize,ZSTDb_buffered);
      if (sVar3 < 0xffffffffffffff89) {
        cctx->inToCompress = 0;
        cctx->inBuffPos = 0;
        cctx->inBuffTarget = (ulong)(cctx->blockSize == pledgedSrcSize) + cctx->blockSize;
        cctx->outBuffContentSize = 0;
        cctx->outBuffFlushedSize = 0;
        cctx->streamStage = zcss_load;
        cctx->frameEnded = 0;
        sVar3 = 0;
      }
      return sVar3;
    }
    __assert_fail("!((dict) && (cdict))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3868,
                  "size_t ZSTD_resetCStream_internal(ZSTD_CStream *, const void *const, const size_t, const ZSTD_dictContentType_e, const ZSTD_CDict *const, ZSTD_CCtx_params, const unsigned long long)"
                 );
  }
  __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x3867,
                "size_t ZSTD_resetCStream_internal(ZSTD_CStream *, const void *const, const size_t, const ZSTD_dictContentType_e, const ZSTD_CDict *const, ZSTD_CCtx_params, const unsigned long long)"
               );
}

Assistant:

static size_t ZSTD_resetCStream_internal(ZSTD_CStream* cctx,
                    const void* const dict, size_t const dictSize, ZSTD_dictContentType_e const dictContentType,
                    const ZSTD_CDict* const cdict,
                    ZSTD_CCtx_params params, unsigned long long const pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_resetCStream_internal");
    /* Finalize the compression parameters */
    params.cParams = ZSTD_getCParamsFromCCtxParams(&params, pledgedSrcSize, dictSize);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    FORWARD_IF_ERROR( ZSTD_compressBegin_internal(cctx,
                                         dict, dictSize, dictContentType, ZSTD_dtlm_fast,
                                         cdict,
                                         &params, pledgedSrcSize,
                                         ZSTDb_buffered) );

    cctx->inToCompress = 0;
    cctx->inBuffPos = 0;
    cctx->inBuffTarget = cctx->blockSize
                      + (cctx->blockSize == pledgedSrcSize);   /* for small input: avoid automatic flush on reaching end of block, since it would require to add a 3-bytes null block to end frame */
    cctx->outBuffContentSize = cctx->outBuffFlushedSize = 0;
    cctx->streamStage = zcss_load;
    cctx->frameEnded = 0;
    return 0;   /* ready to go */
}